

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Bool prvTidyXMLPreserveWhiteSpace(TidyDocImpl *doc,Node *element)

{
  int iVar1;
  Bool BVar2;
  AttVal *pAVar3;
  Parser *pPVar4;
  uint uVar5;
  
  pAVar3 = element->attributes;
  do {
    if (pAVar3 == (AttVal *)0x0) {
      if (element->element == (tmbstr)0x0) {
LAB_00140106:
        BVar2 = no;
      }
      else if (((element->tag == (Dict *)0x0) ||
               (uVar5 = element->tag->id - TidyTag_PRE, 0x13 < uVar5)) ||
              (BVar2 = yes, (0x80401U >> (uVar5 & 0x1f) & 1) == 0)) {
        pPVar4 = prvTidyFindParser(doc,element);
        if (pPVar4 == prvTidyParsePre) {
LAB_0014010a:
          BVar2 = yes;
        }
        else {
          iVar1 = prvTidytmbstrcasecmp(element->element,"xsl:text");
          BVar2 = (Bool)(iVar1 == 0);
        }
      }
      return BVar2;
    }
    if ((pAVar3->dict != (Attribute *)0x0) && (pAVar3->dict->id == TidyAttr_XML_SPACE)) {
      if (pAVar3->value == (ctmbstr)0x0) goto LAB_00140106;
      iVar1 = prvTidytmbstrcasecmp(pAVar3->value,"preserve");
      if (iVar1 != 0) goto LAB_00140106;
      goto LAB_0014010a;
    }
    pAVar3 = pAVar3->next;
  } while( true );
}

Assistant:

Bool TY_(XMLPreserveWhiteSpace)( TidyDocImpl* doc, Node *element)
{
    AttVal *attribute;

    /* search attributes for xml:space */
    for (attribute = element->attributes; attribute; attribute = attribute->next)
    {
        if (attrIsXML_SPACE(attribute))
        {
            if (AttrValueIs(attribute, "preserve"))
                return yes;

            return no;
        }
    }

    if (element->element == NULL)
        return no;
        
    /* kludge for html docs without explicit xml:space attribute */
    if (nodeIsPRE(element)    ||
        nodeIsSCRIPT(element) ||
        nodeIsSTYLE(element)  ||
        TY_(FindParser)(doc, element) == TY_(ParsePre))
        return yes;

    /* kludge for XSL docs */
    if ( TY_(tmbstrcasecmp)(element->element, "xsl:text") == 0 )
        return yes;

    return no;
}